

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O2

void __thiscall
BtorSimVCDWriter::add_value_change(BtorSimVCDWriter *this,int64_t k,int64_t id,BtorSimState state)

{
  pointer pBVar1;
  BtorSimArrayModel *pBVar2;
  int64_t iVar3;
  int32_t iVar4;
  int iVar5;
  iterator iVar6;
  BtorSimBitVector *pBVar7;
  iterator iVar8;
  mapped_type *ppBVar9;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  BtorSimState *this_00;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 this_01;
  __node_base *p_Var10;
  int64_t id_local;
  string sval_1;
  string sval;
  BtorSimBitVector *local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  this_01 = state.field_1;
  id_local = id;
  iVar6 = std::
          _Rb_tree<long,_std::pair<const_long,_BtorSimVCDWriter::ClkType>,_std::_Select1st<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>,_std::less<long>,_std::allocator<std::pair<const_long,_BtorSimVCDWriter::ClkType>_>_>
          ::find(&(this->clocks)._M_t,&id_local);
  if ((_Rb_tree_header *)iVar6._M_node != &(this->clocks)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  if (state.type == ARRAY) {
    if ((BtorSimArrayModel *)this_01.bv_state != (BtorSimArrayModel *)0x0) {
      pBVar2 = (BtorSimArrayModel *)
               (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
               _M_impl.super__Vector_impl_data._M_start[id_local].field_1.bv_state;
      if (pBVar2 != (BtorSimArrayModel *)0x0 && pBVar2 == (BtorSimArrayModel *)this_01.bv_state) {
        return;
      }
      update_time(this,k);
      p_Var10 = &((this_01.array_state)->data)._M_h._M_before_begin;
      src = extraout_RDX;
      do {
        p_Var10 = p_Var10->_M_nxt;
        if (p_Var10 == (__node_base *)0x0) {
          this_00 = (this->prev_value).
                    super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
                    super__Vector_impl_data._M_start + id_local;
          iVar5 = BtorSimArrayModel::copy(this_01.array_state,(EVP_PKEY_CTX *)k,src);
          BtorSimState::update(this_00,(BtorSimArrayModel *)CONCAT44(extraout_var,iVar5));
          return;
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
                *)&sval,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>
                         *)(p_Var10 + 1));
        pBVar2 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                 _M_impl.super__Vector_impl_data._M_start[id_local].field_1.array_state;
        if ((pBVar2 == (BtorSimArrayModel *)0x0) ||
           (iVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(pBVar2->data)._M_h,&sval),
           iVar8.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_true>
           ._M_cur == (__node_type *)0x0)) {
LAB_0010ed8c:
          std::__cxx11::string::string((string *)&sval_1,"",(allocator *)&local_90);
          if (1 < local_a8->width) {
            std::__cxx11::string::append((char *)&sval_1);
          }
          btorsim_bv_to_string_abi_cxx11_(&local_90,local_a8);
          std::__cxx11::string::append((string *)&sval_1);
          std::__cxx11::string::~string((string *)&local_90);
          if (1 < local_a8->width) {
            std::__cxx11::string::append((char *)&sval_1);
          }
          iVar3 = id_local;
          std::__cxx11::string::string((string *)&local_70,(string *)&sval);
          get_am_identifier(&local_50,this,iVar3,&local_70);
          std::operator+(&local_90,&sval_1,&local_50);
          k = (int64_t)&local_90;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->value_changes,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&sval_1);
        }
        else {
          k = (int64_t)&sval;
          ppBVar9 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&((this->prev_value).
                              super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                              _M_impl.super__Vector_impl_data._M_start[id_local].field_1.array_state
                             )->data,(key_type *)k);
          if (*ppBVar9 != local_a8) goto LAB_0010ed8c;
        }
        std::__cxx11::string::~string((string *)&sval);
        src = extraout_RDX_00;
      } while( true );
    }
  }
  else {
    if (state.type != BITVEC) {
      die("Invalid state");
      return;
    }
    if ((BtorSimArrayModel *)this_01.bv_state != (BtorSimArrayModel *)0x0) {
      pBVar7 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
               _M_impl.super__Vector_impl_data._M_start[id_local].field_1.bv_state;
      if ((pBVar7 != (BtorSimBitVector *)0x0) &&
         (iVar4 = btorsim_bv_compare(this_01.bv_state,pBVar7), iVar4 == 0)) {
        return;
      }
      update_time(this,k);
      std::__cxx11::string::string((string *)&sval,"",(allocator *)&sval_1);
      if (1 < (uint)*(uint64_t *)&(this_01.bv_state)->width) {
        std::__cxx11::string::append((char *)&sval);
      }
      btorsim_bv_to_string_abi_cxx11_(&sval_1,this_01.bv_state);
      std::__cxx11::string::append((string *)&sval);
      std::__cxx11::string::~string((string *)&sval_1);
      if (1 < (uint)*(uint64_t *)&(this_01.bv_state)->width) {
        std::__cxx11::string::append((char *)&sval);
      }
      get_bv_identifier_abi_cxx11_(&local_90,this,id_local);
      std::operator+(&sval_1,&sval,&local_90);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->value_changes,&sval_1);
      std::__cxx11::string::~string((string *)&sval_1);
      std::__cxx11::string::~string((string *)&local_90);
      iVar3 = id_local;
      pBVar1 = (this->prev_value).super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar7 = btorsim_bv_copy(this_01.bv_state);
      BtorSimState::update(pBVar1 + iVar3,pBVar7);
      std::__cxx11::string::~string((string *)&sval);
      return;
    }
  }
  msg(1,"No current state for named state %ld!",id_local);
  return;
}

Assistant:

void
BtorSimVCDWriter::add_value_change (int64_t k, int64_t id, BtorSimState state)
{
  if (clocks.find (id) != clocks.end ()) return;
  switch (state.type)
  {
    case BtorSimState::Type::BITVEC: {
      if (!state.bv_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }
      if (!prev_value[id].bv_state
          || btorsim_bv_compare (state.bv_state, prev_value[id].bv_state))
      {
        update_time (k);
        std::string sval ("");
        if (state.bv_state->width > 1) sval += "b";
        sval += btorsim_bv_to_string (state.bv_state);
        if (state.bv_state->width > 1) sval += " ";
        value_changes.push_back (sval + get_bv_identifier (id));
        prev_value[id].update (btorsim_bv_copy (state.bv_state));
      }
    }
    break;
    case BtorSimState::Type::ARRAY: {
      if (!state.array_state)
      {
        msg (1, "No current state for named state %" PRId64 "!", id);
        return;
      }

      if (!prev_value[id].array_state
          || state.array_state != prev_value[id].array_state)
      {
        update_time (k);
        for (auto it : state.array_state->data)
        {
          if (!prev_value[id].array_state
              || prev_value[id].array_state->data.find (it.first)
                     == prev_value[id].array_state->data.end ()
              || prev_value[id].array_state->data.at (it.first) != it.second)
          {
            std::string sval ("");
            if (it.second->width > 1) sval += "b";
            sval += btorsim_bv_to_string (it.second);
            if (it.second->width > 1) sval += " ";
            value_changes.push_back (sval + get_am_identifier (id, it.first));
          }
        }
        prev_value[id].update (state.array_state->copy ());
      }
    }
    break;
    default: die ("Invalid state");
  }
}